

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int i;
  ulong uVar2;
  initializer_list<const_SSM::Observable_*> __l;
  Observables observables;
  Values values;
  long local_160;
  _Function_base local_150;
  KnockSignal2 knock_2;
  KnockSignal1 knock_1;
  NeutralPositionSwitch nt_sw;
  KnockingCorrection kn_corr;
  ThrottlePedal thr;
  EngineLoad en_load;
  AirFuelLeanCorrection af_lean_corr;
  IntakeAirTemperature intake_temp;
  ExhaustGasTemperature exhaust_gas_temp;
  ManifoldRelativePressure manifold_pressure;
  EngineSpeed engine_speed;
  BatteryVoltage battery_voltage;
  ResultHandler handler;
  type callback;
  ECUPort ECU;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&callback,"/dev/ttyUSB0",(allocator<char> *)&observables);
  SSM::ECUPort::ECUPort(&ECU,(string *)&callback);
  std::__cxx11::string::~string((string *)&callback);
  callback._M_f = (offset_in_ResultHandler_to_subr)&battery_voltage;
  battery_voltage.super_OneByteObservable.super_Observable._vptr_Observable =
       (OneByteObservable)&PTR_convert_001078a8;
  callback._8_8_ = &engine_speed;
  engine_speed.super_TwoByteObservable.super_Observable._vptr_Observable =
       (TwoByteObservable)&PTR_convert_00107930;
  callback._M_bound_args.
  super__Tuple_impl<0UL,_ResultHandler_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_ResultHandler_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_ResultHandler_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       &manifold_pressure;
  manifold_pressure.super_OneByteObservable.super_Observable._vptr_Observable =
       (OneByteObservable)&PTR_convert_001079a8;
  knock_2.super_SwitchObservable.super_Observable._vptr_Observable =
       (SwitchObservable)&PTR_convert_00107d10;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&callback;
  std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::vector
            (&observables,__l,(allocator_type *)&values);
  SSM::ECUPort::singleRead((vector *)&values);
  if ((long)observables.
            super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)observables.
            super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
            _M_impl.super__Vector_impl_data._M_start == local_160 - _values) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Single read results:");
    std::endl<char,std::char_traits<char>>(poVar1);
    for (uVar2 = 0; uVar2 < (ulong)(local_160 - _values >> 3); uVar2 = uVar2 + 1) {
      SSM::ECUPort::isAvailable((Observable *)&ECU);
      poVar1 = std::ostream::_M_insert<bool>(true);
      std::operator<<(poVar1," | ");
      poVar1 = std::ostream::_M_insert<double>(*(double *)(_values + uVar2 * 8));
      poVar1 = std::operator<<(poVar1," ");
      (*observables.
        super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar2]->_vptr_Observable[1])(&callback);
      poVar1 = std::operator<<(poVar1,(string *)&callback);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&callback);
    }
    callback._M_bound_args.
    super__Tuple_impl<0UL,_ResultHandler_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
    super__Head_base<0UL,_ResultHandler_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ResultHandler_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)&handler;
    handler.m_maxcall = 100;
    handler.m_callcount = 0;
    callback._M_f = (offset_in_ResultHandler_to_subr)ResultHandler::handle;
    callback._8_8_ = 0;
    poVar1 = std::operator<<((ostream *)&std::cout,"\nStarting continuous read:");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::
    function<int(std::vector<SSM::Observable_const*,std::allocator<SSM::Observable_const*>>const&,std::vector<double,std::allocator<double>>const&)>
    ::
    function<std::_Bind<int(ResultHandler::*(ResultHandler*,std::_Placeholder<1>,std::_Placeholder<2>))(std::vector<SSM::Observable_const*,std::allocator<SSM::Observable_const*>>const&,std::vector<double,std::allocator<double>>const&)>&,void>
              ((function<int(std::vector<SSM::Observable_const*,std::allocator<SSM::Observable_const*>>const&,std::vector<double,std::allocator<double>>const&)>
                *)&local_150,&callback);
    SSM::ECUPort::continuousRead(&ECU,&observables,&local_150);
    std::_Function_base::~_Function_base(&local_150);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&values);
    std::_Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::
    ~_Vector_base(&observables.
                   super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                 );
    SSM::ECUPort::~ECUPort(&ECU);
    return 0;
  }
  __assert_fail("observables.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Silvan-K[P]libsubarussm/src/Example.cc"
                ,0x3f,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv)
{
  SSM::ECUPort ECU("/dev/ttyUSB0");

  SSM::BatteryVoltage           battery_voltage;
  SSM::EngineSpeed              engine_speed;
  SSM::ManifoldRelativePressure manifold_pressure;
  SSM::ExhaustGasTemperature    exhaust_gas_temp;
  SSM::IntakeAirTemperature     intake_temp;
  SSM::AirFuelLeanCorrection    af_lean_corr;
  SSM::EngineLoad               en_load;
  SSM::ThrottlePedal            thr;
  SSM::KnockingCorrection       kn_corr;
  SSM::NeutralPositionSwitch    nt_sw;
  SSM::KnockSignal1             knock_1;
  SSM::KnockSignal2             knock_2;
  
  SSM::Observables observables { &battery_voltage,
				 &engine_speed,
				 &manifold_pressure,
				 &exhaust_gas_temp,
				 &intake_temp,
				 &af_lean_corr,
				 &en_load,
				 &thr,
				 &kn_corr,
				 &nt_sw,
				 &knock_1,
				 &knock_2 };

  SSM::Values values = ECU.singleRead(observables);
  assert(observables.size() == values.size());

  std::cout << "Single read results:" << std::endl;
  for(int i(0); i<values.size(); i++)
    std::cout << ECU.isAvailable(*observables[i])
	      << " | " << values[i] << " "
	      << observables[i]->unit() << std::endl;

  ResultHandler handler(100);
  auto callback = std::bind(&ResultHandler::handle, 
			    &handler, 
			    std::placeholders::_1,
			    std::placeholders::_2);

  std::cout << "\nStarting continuous read:" << std::endl;
  ECU.continuousRead(observables, callback);
}